

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_compute_fluxes_from_state.cpp
# Opt level: O0

void HydroUtils::ComputeFluxesOnBoxFromState
               (Box *bx,int ncomp,MFIter *mfi,Array4<const_double> *q,Array4<double> *flux_x,
               Array4<double> *flux_y,Array4<double> *flux_z,Array4<double> *face_x,
               Array4<double> *face_y,Array4<double> *face_z,bool knownFaceState,
               Array4<const_double> *u_mac,Array4<const_double> *v_mac,Array4<const_double> *w_mac,
               Array4<const_double> *divu,Array4<const_double> *fq,Geometry geom,Real l_dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec,
               int *iconserv,EBFArrayBoxFactory *ebfact,bool godunov_use_ppm,
               bool godunov_use_forces_in_trans,bool is_velocity,bool fluxes_are_area_weighted,
               string *advection_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined8 in_XMM0_Qa;
  byte in_stack_00000028;
  undefined8 in_stack_00000120;
  undefined8 in_stack_00000128;
  undefined8 in_stack_00000130;
  undefined8 in_stack_00000138;
  byte in_stack_00000140;
  byte in_stack_00000148;
  byte in_stack_00000150;
  byte in_stack_00000158;
  undefined8 in_stack_00000160;
  undefined1 in_stack_0000086c;
  undefined1 in_stack_0000086d;
  undefined1 in_stack_0000086e;
  undefined1 in_stack_0000086f;
  Real in_stack_00000870;
  undefined1 in_stack_0000087f;
  Array4<double> *in_stack_00000880;
  Array4<double> *in_stack_00000888;
  Array4<const_double> *in_stack_00000890;
  MFIter *in_stack_00000898;
  int in_stack_000008a4;
  Box *in_stack_000008a8;
  Array4<double> *in_stack_00000a10;
  Array4<double> *in_stack_00000a18;
  Array4<double> *in_stack_00000a20;
  Array4<double> *in_stack_00000a28;
  Array4<const_double> *in_stack_00000a38;
  Array4<const_double> *in_stack_00000a40;
  Array4<const_double> *in_stack_00000a48;
  Array4<const_double> *in_stack_00000a50;
  Array4<const_double> *in_stack_00000a58;
  Geometry in_stack_00000a60;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000b28;
  BCRec *in_stack_00000b30;
  int *in_stack_00000b38;
  EBFArrayBoxFactory *in_stack_00000b40;
  Array4<const_double> *in_stack_00000b48;
  string *in_stack_00000b70;
  undefined8 auStack_338 [25];
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  Array4<const_double> *local_250;
  uint local_248;
  uint local_240;
  uint local_238;
  uint local_230;
  undefined8 local_228;
  byte local_211;
  undefined8 local_1f8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  Array4<const_double> local_180;
  undefined8 local_140 [25];
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  undefined8 local_70;
  byte local_61;
  
  bVar8 = 0;
  local_211 = in_stack_00000028 & 1;
  local_71 = in_stack_00000140 & 1;
  local_72 = in_stack_00000148 & 1;
  local_73 = in_stack_00000150 & 1;
  local_74 = in_stack_00000158 & 1;
  local_70 = in_XMM0_Qa;
  local_61 = local_211;
  memcpy(local_140,&stack0x00000058,200);
  local_1f8 = local_70;
  local_1c0 = in_stack_00000120;
  local_1c8 = in_stack_00000128;
  local_1d0 = in_stack_00000130;
  local_1d8 = in_stack_00000138;
  amrex::Array4<const_double>::Array4(&local_180);
  bVar4 = local_71;
  bVar3 = local_72;
  bVar2 = local_73;
  bVar1 = local_74;
  local_1e0 = in_stack_00000160;
  puVar6 = local_140;
  puVar7 = auStack_338;
  for (lVar5 = 0x19; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  local_228 = local_1e0;
  local_250 = &local_180;
  local_258 = local_1d8;
  local_260 = local_1d0;
  local_268 = local_1c8;
  local_270 = local_1c0;
  local_230 = bVar1 & 1;
  local_238 = bVar2 & 1;
  local_240 = bVar3 & 1;
  local_248 = bVar4 & 1;
  ComputeFluxesOnBoxFromState
            (in_stack_000008a8,in_stack_000008a4,in_stack_00000898,in_stack_00000890,
             in_stack_00000888,in_stack_00000880,in_stack_00000a10,in_stack_00000a18,
             in_stack_00000a20,in_stack_00000a28,(bool)in_stack_0000087f,in_stack_00000a38,
             in_stack_00000a40,in_stack_00000a48,in_stack_00000a50,in_stack_00000a58,
             in_stack_00000a60,in_stack_00000870,in_stack_00000b28,in_stack_00000b30,
             in_stack_00000b38,in_stack_00000b40,in_stack_00000b48,(bool)in_stack_0000086f,
             (bool)in_stack_0000086e,(bool)in_stack_0000086d,(bool)in_stack_0000086c,
             in_stack_00000b70);
  return;
}

Assistant:

void
HydroUtils::ComputeFluxesOnBoxFromState (Box const& bx, int ncomp, MFIter& mfi,
                                         Array4<Real const> const& q,
                                         AMREX_D_DECL(Array4<Real> const& flux_x,
                                                      Array4<Real> const& flux_y,
                                                      Array4<Real> const& flux_z),
                                         AMREX_D_DECL(Array4<Real> const& face_x,
                                                      Array4<Real> const& face_y,
                                                      Array4<Real> const& face_z),
                                         bool knownFaceState,
                                         AMREX_D_DECL(Array4<Real const> const& u_mac,
                                                      Array4<Real const> const& v_mac,
                                                      Array4<Real const> const& w_mac),
                                         Array4<Real const> const& divu,
                                         Array4<Real const> const& fq,
                                         Geometry geom, Real l_dt,
                                         Vector<BCRec> const& h_bcrec,
                                         const BCRec* d_bcrec,
                                         int const* iconserv,
                                         const EBFArrayBoxFactory& ebfact,
                                         bool godunov_use_ppm, bool godunov_use_forces_in_trans,
                                         bool is_velocity, bool fluxes_are_area_weighted,
                                         std::string& advection_type)

{
    ComputeFluxesOnBoxFromState(bx, ncomp, mfi, q,
                                AMREX_D_DECL(flux_x, flux_y, flux_z),
                                AMREX_D_DECL(face_x, face_y, face_z),
                                knownFaceState,
                                AMREX_D_DECL(u_mac, v_mac, w_mac),
                                divu, fq, geom, l_dt, h_bcrec, d_bcrec, iconserv,
                                ebfact, /*values_on_eb_inflow*/ Array4<Real const>{},
                                godunov_use_ppm, godunov_use_forces_in_trans,
                                is_velocity, fluxes_are_area_weighted, advection_type);

}